

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_copy_range(roaring_array_t *ra,uint32_t begin,uint32_t end,uint32_t new_begin)

{
  int iVar1;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int range;
  
  iVar1 = in_EDX - in_ESI;
  memmove((void *)(*(long *)(in_RDI + 8) + (ulong)in_ECX * 8),
          (void *)(*(long *)(in_RDI + 8) + (ulong)in_ESI * 8),(long)iVar1 << 3);
  memmove((void *)(*(long *)(in_RDI + 0x10) + (ulong)in_ECX * 2),
          (void *)(*(long *)(in_RDI + 0x10) + (ulong)in_ESI * 2),(long)iVar1 << 1);
  memmove((void *)(*(long *)(in_RDI + 0x18) + (ulong)in_ECX),
          (void *)(*(long *)(in_RDI + 0x18) + (ulong)in_ESI),(long)iVar1);
  return;
}

Assistant:

void ra_copy_range(roaring_array_t *ra, uint32_t begin, uint32_t end,
                   uint32_t new_begin) {
    assert(begin <= end);
    assert(new_begin < begin);

    const int range = end - begin;

    // We ensure to previously have freed overwritten containers
    // that are not copied elsewhere

    memmove(&(ra->containers[new_begin]), &(ra->containers[begin]),
            sizeof(container_t *) * range);
    memmove(&(ra->keys[new_begin]), &(ra->keys[begin]),
            sizeof(uint16_t) * range);
    memmove(&(ra->typecodes[new_begin]), &(ra->typecodes[begin]),
            sizeof(uint8_t) * range);
}